

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateInfoSetBrokerKey(HelicsFederateInfo fedInfo,char *brokerkey,HelicsError *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  HelicsFederateInfo pvVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (fedInfo == (HelicsFederateInfo)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a0b34;
    }
    else {
      bVar4 = *(int *)((long)fedInfo + 0x48) == 0x6bfbbce1;
      pvVar3 = (HelicsFederateInfo)0x0;
      if (bVar4) {
        pvVar3 = fedInfo;
      }
      if (bVar4 || err == (HelicsError *)0x0) goto LAB_001a0b37;
    }
    err->error_code = -3;
    err->message = "helics Federate info object was not valid";
  }
LAB_001a0b34:
  pvVar3 = (HelicsFederateInfo)0x0;
LAB_001a0b37:
  if (pvVar3 != (HelicsFederateInfo)0x0) {
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    if (brokerkey == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar2 = strlen(brokerkey);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,brokerkey,brokerkey + sVar2);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)pvVar3 + 0x140),&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void helicsFederateInfoSetBrokerKey(HelicsFederateInfo fedInfo, const char* brokerkey, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    try {
        info->key = AS_STRING(brokerkey);
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}